

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

ArrayRef<int> * __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::InitialValuesSparsity
          (BasicProblem<mp::BasicProblemParams<int>_> *this)

{
  ArrayRef<int> *in_RSI;
  ArrayRef<int> *in_RDI;
  
  ArrayRef<int>::ArrayRef(in_RSI,&in_RDI->save_);
  return in_RDI;
}

Assistant:

ArrayRef<int> InitialValuesSparsity() const { return iv_set_; }